

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sec-utils.c
# Opt level: O0

uint8_t * readAsn1Int(uint8_t *input,uint8_t *end,uint8_t *output)

{
  byte *pbVar1;
  uint local_30;
  byte local_29;
  uint8_t length;
  uint8_t *output_local;
  uint8_t *end_local;
  uint8_t *input_local;
  
  if ((input == end) || (pbVar1 = input + 1, *input != '\x02')) {
    input_local = (uint8_t *)0x0;
  }
  else {
    if (pbVar1 == end) {
      local_30 = 0;
      end_local = pbVar1;
    }
    else {
      end_local = input + 2;
      local_30 = (uint)*pbVar1;
    }
    local_29 = (byte)local_30;
    if ((local_29 == 0) || (end < end_local + (int)local_30)) {
      input_local = (uint8_t *)0x0;
    }
    else {
      if (local_29 == 0x21) {
        local_29 = 0x20;
        end_local = end_local + 1;
      }
      memcpy(output + (0x20 - (long)(int)(uint)local_29),end_local,(ulong)local_29);
      input_local = end_local + (int)(uint)local_29;
    }
  }
  return input_local;
}

Assistant:

static const uint8_t*
readAsn1Int(const uint8_t* input, const uint8_t* end, uint8_t* output)
{
  if (input == end || *(input++) != ASN1_INTEGER)
    return NULL;

  uint8_t length = (input == end) ? 0 : *(input++);
  if (length == 0 || input + length > end)
    return NULL;

  if (length == 33) {
    --length;
    ++input;
  }
  memcpy(output + 32 - length, input, length);
  return input + length;
}